

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_12d4bb::CompressorState::process
          (CompressorState *this,size_t samplesToDo,
          span<const_std::array<float,_1024UL>,_18446744073709551615UL> samplesIn,
          span<std::array<float,_1024UL>,_18446744073709551615UL> samplesOut)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  size_t i;
  float (*pafVar4) [16];
  pointer paVar5;
  ulong uVar6;
  pointer paVar7;
  ulong uVar8;
  pointer paVar9;
  float (*pafVar10) [16];
  float *pfVar11;
  float *pfVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float afStack_438 [258];
  
  paVar5 = samplesIn.mData;
  bVar3 = this->mEnabled;
  for (uVar6 = 0; uVar13 = samplesToDo - uVar6, uVar6 <= samplesToDo && uVar13 != 0;
      uVar6 = uVar6 + uVar13) {
    if (0xff < uVar13) {
      uVar13 = 0x100;
    }
    fVar15 = this->mEnvFollower;
    fVar1 = this->mAttackMult;
    fVar2 = this->mReleaseMult;
    if ((bVar3 & 1U) == 0) {
      for (uVar8 = 0; uVar13 != uVar8; uVar8 = uVar8 + 1) {
        if (1.0 <= fVar15) {
          if ((1.0 < fVar15) && (fVar15 = fVar15 * fVar2, fVar15 <= 1.0)) {
            fVar15 = 1.0;
          }
        }
        else {
          fVar16 = fVar15 * fVar1;
          fVar15 = 1.0;
          if (fVar16 <= 1.0) {
            fVar15 = fVar16;
          }
        }
        afStack_438[uVar8] = 1.0 / fVar15;
      }
    }
    else {
      for (uVar8 = 0; uVar13 != uVar8; uVar8 = uVar8 + 1) {
        fVar16 = 0.5;
        if (0.5 <= ABS(paVar5->_M_elems[uVar6 + uVar8])) {
          fVar16 = ABS(paVar5->_M_elems[uVar6 + uVar8]);
        }
        if (2.0 <= fVar16) {
          fVar16 = 2.0;
        }
        if (fVar16 <= fVar15) {
          if ((fVar16 < fVar15) && (fVar15 = fVar15 * fVar2, fVar15 <= fVar16)) {
            fVar15 = fVar16;
          }
        }
        else {
          fVar14 = fVar15 * fVar1;
          fVar15 = fVar16;
          if (fVar14 <= fVar16) {
            fVar15 = fVar14;
          }
        }
        afStack_438[uVar8] = 1.0 / fVar15;
      }
    }
    pfVar11 = paVar5->_M_elems + uVar6;
    this->mEnvFollower = fVar15;
    pafVar4 = this->mGain;
    for (paVar7 = paVar5; paVar9 = samplesOut.mData, pafVar10 = pafVar4,
        pfVar12 = (samplesOut.mData)->_M_elems + uVar6, paVar7 != samplesIn.mDataEnd;
        paVar7 = paVar7 + 1) {
      for (; paVar9 != samplesOut.mDataEnd; paVar9 = paVar9 + 1) {
        fVar15 = (*pafVar10)[0];
        if (1e-05 < ABS(fVar15)) {
          for (uVar8 = 0; uVar13 != uVar8; uVar8 = uVar8 + 1) {
            pfVar12[uVar8] = pfVar11[uVar8] * afStack_438[uVar8] * fVar15 + pfVar12[uVar8];
          }
        }
        pafVar10 = (float (*) [16])(*pafVar10 + 1);
        pfVar12 = pfVar12 + 0x400;
      }
      pafVar4 = pafVar4 + 1;
      pfVar11 = pfVar11 + 0x400;
    }
  }
  return;
}

Assistant:

void CompressorState::process(const size_t samplesToDo,
    const al::span<const FloatBufferLine> samplesIn, const al::span<FloatBufferLine> samplesOut)
{
    for(size_t base{0u};base < samplesToDo;)
    {
        float gains[256];
        const size_t td{minz(256, samplesToDo-base)};

        /* Generate the per-sample gains from the signal envelope. */
        float env{mEnvFollower};
        if(mEnabled)
        {
            for(size_t i{0u};i < td;++i)
            {
                /* Clamp the absolute amplitude to the defined envelope limits,
                 * then attack or release the envelope to reach it.
                 */
                const float amplitude{clampf(std::fabs(samplesIn[0][base+i]), AMP_ENVELOPE_MIN,
                    AMP_ENVELOPE_MAX)};
                if(amplitude > env)
                    env = minf(env*mAttackMult, amplitude);
                else if(amplitude < env)
                    env = maxf(env*mReleaseMult, amplitude);

                /* Apply the reciprocal of the envelope to normalize the volume
                 * (compress the dynamic range).
                 */
                gains[i] = 1.0f / env;
            }
        }
        else
        {
            /* Same as above, except the amplitude is forced to 1. This helps
             * ensure smooth gain changes when the compressor is turned on and
             * off.
             */
            for(size_t i{0u};i < td;++i)
            {
                const float amplitude{1.0f};
                if(amplitude > env)
                    env = minf(env*mAttackMult, amplitude);
                else if(amplitude < env)
                    env = maxf(env*mReleaseMult, amplitude);

                gains[i] = 1.0f / env;
            }
        }
        mEnvFollower = env;

        /* Now compress the signal amplitude to output. */
        auto changains = std::addressof(mGain[0]);
        for(const auto &input : samplesIn)
        {
            const float *outgains{*(changains++)};
            for(FloatBufferLine &output : samplesOut)
            {
                const float gain{*(outgains++)};
                if(!(std::fabs(gain) > GainSilenceThreshold))
                    continue;

                for(size_t i{0u};i < td;i++)
                    output[base+i] += input[base+i] * gains[i] * gain;
            }
        }

        base += td;
    }
}